

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O1

void test_one<std::vector<long,std::allocator<long>>,k_ary_constructor<long>>
               (vector<long,_std::allocator<long>_> *numbers,size_t attempt_count,
               k_ary_constructor<long> *constructor)

{
  value_type_conflict2 *value;
  pointer plVar1;
  clock_t cVar2;
  clock_t cVar3;
  ulong uVar4;
  clock_t cVar5;
  const_iterator cVar6;
  clock_t cVar7;
  ostream *poVar8;
  runtime_error *this;
  size_t sVar9;
  long lVar10;
  undefined1 auVar11 [16];
  k_ary_search_set<long,_std::less<void>_> set;
  double local_78;
  k_ary_search_set<long,_std::less<void>_> local_58;
  
  cVar2 = clock();
  k_ary_constructor<long>::operator()
            (&local_58,constructor,
             (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
             (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
             (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  cVar3 = clock();
  if (attempt_count == 0) {
    local_78 = 0.0;
  }
  else {
    lVar10 = 0;
    sVar9 = attempt_count;
    do {
      uVar4 = random();
      plVar1 = (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      value = plVar1 + uVar4 % (ulong)((long)(numbers->
                                             super__Vector_base<long,_std::allocator<long>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)plVar1 >> 3);
      cVar5 = clock();
      cVar6 = burst::k_ary_search_set<long,_std::less<void>_>::find_impl(&local_58,value);
      cVar7 = clock();
      if ((cVar6._M_current ==
           local_58.m_values.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish) || (*cVar6._M_current != *value)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,anon_var_dwarf_2d551);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar10 = (lVar10 - cVar5) + cVar7;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
    local_78 = (double)lVar10;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_2d56a,0x1e);
  poVar8 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_2d583,0x29);
  auVar11._8_4_ = (int)(attempt_count >> 0x20);
  auVar11._0_8_ = attempt_count;
  auVar11._12_4_ = 0x45300000;
  poVar8 = std::ostream::_M_insert<double>
                     ((local_78 /
                      ((auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)attempt_count) - 4503599627370496.0))) /
                      1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (local_58.m_values.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_values.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.m_values.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.m_values.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_one (const Container & numbers, std::size_t attempt_count, const SetConstructor & constructor)
{
    clock_t creation_time = clock();
    auto set = constructor(numbers.begin(), numbers.end());
    creation_time = clock() - creation_time;

    clock_t search_time = 0;
    for (std::size_t attempt = 0; attempt < attempt_count; ++attempt)
    {
        const auto & element = numbers[static_cast<std::size_t>(random()) % numbers.size()];

        clock_t attempt_time = clock();
        auto search_result = set.find(element);
        attempt_time = clock() - attempt_time;

        if (search_result == set.end() || *search_result != element)
        {
            throw std::runtime_error("Нашлись не все искомые элементы.");
        }

        search_time += attempt_time;
    }

    std::cout << "\tВремя создания: " << static_cast<double>(creation_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << "\tСреднее время поиска: " << static_cast<double>(search_time) / static_cast<double>(attempt_count) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}